

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

bool mg::fs::write_file(char *path,string_view *data)

{
  FILE *pFVar1;
  int __fd;
  int *piVar2;
  char *pcVar3;
  const_reference __buf;
  size_type sVar4;
  ssize_t sVar5;
  ulong uStack_48;
  int wrote_bytes;
  size_t total_bytes_written;
  undefined1 local_38 [8];
  shared_ptr<void> _defer_close_fd;
  int fd;
  string_view *data_local;
  char *path_local;
  
  _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       open(path,0x242,0x1a4);
  pFVar1 = _stderr;
  if (_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(pFVar1,"Failed to open \'%s\' - %s\n",path,pcVar3);
    path_local._7_1_ = false;
  }
  else {
    std::shared_ptr<void>::
    shared_ptr<mg::fs::write_file(char_const*,std::basic_string_view<char,std::char_traits<char>>const&)::__0>
              ((shared_ptr<void> *)local_38,(nullptr_t)0x0,
               _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    uStack_48 = 0;
    do {
      __fd = _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_;
      __buf = std::basic_string_view<char,_std::char_traits<char>_>::operator[](data,uStack_48);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(data);
      sVar5 = write(__fd,__buf,sVar4 - uStack_48);
      pFVar1 = _stderr;
      if ((int)sVar5 == -1) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(pFVar1,"Failed to write \'%s\' - %s\n",path,pcVar3);
        path_local._7_1_ = false;
        goto LAB_00112785;
      }
      uStack_48 = (long)(int)sVar5 + uStack_48;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(data);
    } while (uStack_48 < sVar4);
    path_local._7_1_ = true;
LAB_00112785:
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_38);
  }
  return path_local._7_1_;
}

Assistant:

bool write_file(const char *path, const std::string_view &data) {
  // Open file
  const int fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0644);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  size_t total_bytes_written = 0;
  do {
    int wrote_bytes = write(fd, &data[total_bytes_written],
                            data.size() - total_bytes_written);
    if (wrote_bytes == -1) {
      fprintf(stderr, "Failed to write '%s' - %s\n", path, strerror(errno));
      return false;
    }
    total_bytes_written += wrote_bytes;
  } while (total_bytes_written < data.size());

  return true;
}